

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_cover.cc
# Opt level: O2

base_learner * active_cover_setup(options_i *options,vw *all)

{
  int iVar1;
  size_t i;
  option_group_definition *poVar2;
  typed_option<float> *ptVar3;
  typed_option<unsigned_long> *ptVar4;
  base_learner *l;
  single_learner *base;
  float *pfVar5;
  learner<active_cover,_example> *plVar6;
  vw_exception *pvVar7;
  _Head_base<0UL,_active_cover_*,_false> _Var8;
  ulong uVar9;
  ulong uVar10;
  bool active_cover_option;
  allocator local_ac4;
  allocator local_ac3;
  allocator local_ac2;
  allocator local_ac1;
  allocator local_ac0;
  allocator local_abf;
  allocator local_abe;
  allocator local_abd;
  allocator local_abc;
  allocator local_abb;
  allocator local_aba;
  allocator local_ab9;
  free_ptr<active_cover> data;
  string local_aa8 [32];
  string local_a88;
  string local_a68 [32];
  string local_a48;
  string local_a28 [32];
  string local_a08;
  string local_9e8 [32];
  string local_9c8;
  string local_9a8 [32];
  string local_988;
  string local_968 [32];
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  option_group_definition new_options;
  stringstream __msg;
  undefined1 local_880 [96];
  bool local_820;
  typed_option<float> local_708;
  undefined1 local_668 [160];
  typed_option<bool> local_5c8;
  typed_option<unsigned_long> local_528;
  typed_option<unsigned_long> local_488;
  typed_option<float> local_3e8;
  typed_option<float> local_348;
  typed_option<float> local_2a8;
  typed_option<float> local_208;
  typed_option<float> local_168;
  typed_option<bool> local_c8;
  
  scoped_calloc_or_throw<active_cover>();
  std::__cxx11::string::string
            ((string *)&local_928,"Active Learning with Cover",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_928);
  std::__cxx11::string::~string((string *)&local_928);
  active_cover_option = false;
  std::__cxx11::string::string((string *)&local_948,"active_cover",&local_ab9);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&__msg,&local_948,&active_cover_option);
  local_820 = true;
  std::__cxx11::string::string(local_968,"enable active learning with cover",&local_aba);
  std::__cxx11::string::_M_assign((string *)(local_880 + 0x20));
  VW::config::typed_option<bool>::typed_option(&local_c8,(typed_option<bool> *)&__msg);
  poVar2 = VW::config::option_group_definition::add<bool>(&new_options,&local_c8);
  std::__cxx11::string::string((string *)&local_988,"mellowness",&local_abb);
  VW::config::typed_option<float>::typed_option
            (&local_708,&local_988,
             &(data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->active_c0);
  ptVar3 = VW::config::typed_option<float>::default_value(&local_708,8.0);
  std::__cxx11::string::string
            (local_9a8,"active learning mellowness parameter c_0. Default 8.",&local_abc);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_168,ptVar3);
  poVar2 = VW::config::option_group_definition::add<float>(poVar2,&local_168);
  std::__cxx11::string::string((string *)&local_9c8,"alpha",&local_abd);
  VW::config::typed_option<float>::typed_option
            (&local_2a8,&local_9c8,
             &(data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->alpha);
  ptVar3 = VW::config::typed_option<float>::default_value(&local_2a8,1.0);
  std::__cxx11::string::string
            (local_9e8,"active learning variance upper bound parameter alpha. Default 1.",&local_abe
            );
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_208,ptVar3);
  poVar2 = VW::config::option_group_definition::add<float>(poVar2,&local_208);
  std::__cxx11::string::string((string *)&local_a08,"beta_scale",&local_abf);
  VW::config::typed_option<float>::typed_option
            (&local_3e8,&local_a08,
             &(data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->beta_scale);
  ptVar3 = VW::config::typed_option<float>::default_value(&local_3e8,3.1622777);
  std::__cxx11::string::string
            (local_a28,
             "active learning variance upper bound parameter beta_scale. Default sqrt(10).",
             &local_ac0);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_348,ptVar3);
  poVar2 = VW::config::option_group_definition::add<float>(poVar2,&local_348);
  std::__cxx11::string::string((string *)&local_a48,"cover",&local_ac1);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_528,&local_a48,
             &(data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->cover_size);
  local_528.super_base_option.m_keep = true;
  ptVar4 = VW::config::typed_option<unsigned_long>::default_value(&local_528,0xc);
  std::__cxx11::string::string(local_a68,"cover size. Default 12.",&local_ac2);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_488,ptVar4);
  poVar2 = VW::config::option_group_definition::add<unsigned_long>(poVar2,&local_488);
  std::__cxx11::string::string((string *)&local_a88,"oracular",&local_ac3);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_668,&local_a88,
             &(data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->oracular);
  std::__cxx11::string::string
            (local_aa8,"Use Oracular-CAL style query or not. Default false.",&local_ac4);
  std::__cxx11::string::_M_assign((string *)(local_668 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_5c8,(typed_option<bool> *)local_668);
  VW::config::option_group_definition::add<bool>(poVar2,&local_5c8);
  VW::config::typed_option<bool>::~typed_option(&local_5c8);
  std::__cxx11::string::~string(local_aa8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_668);
  std::__cxx11::string::~string((string *)&local_a88);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_488);
  std::__cxx11::string::~string(local_a68);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_528);
  std::__cxx11::string::~string((string *)&local_a48);
  VW::config::typed_option<float>::~typed_option(&local_348);
  std::__cxx11::string::~string(local_a28);
  VW::config::typed_option<float>::~typed_option(&local_3e8);
  std::__cxx11::string::~string((string *)&local_a08);
  VW::config::typed_option<float>::~typed_option(&local_208);
  std::__cxx11::string::~string(local_9e8);
  VW::config::typed_option<float>::~typed_option(&local_2a8);
  std::__cxx11::string::~string((string *)&local_9c8);
  VW::config::typed_option<float>::~typed_option(&local_168);
  std::__cxx11::string::~string(local_9a8);
  VW::config::typed_option<float>::~typed_option(&local_708);
  std::__cxx11::string::~string((string *)&local_988);
  VW::config::typed_option<bool>::~typed_option(&local_c8);
  std::__cxx11::string::~string(local_968);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&local_948);
  (**options->_vptr_options_i)(options,&new_options);
  if (active_cover_option == false) {
    plVar6 = (learner<active_cover,_example> *)0x0;
  }
  else {
    (data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->all = all;
    (data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->beta_scale =
         (data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->beta_scale *
         (data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->beta_scale;
    if ((data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->oracular == true) {
      (data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->cover_size = 0;
    }
    std::__cxx11::string::string((string *)&__msg,"lda",(allocator *)&local_708);
    iVar1 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar1 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_880,"error: you can\'t combine lda and active learning");
      pvVar7 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/active_cover.cc"
                 ,0x101,&local_8e8);
      __cxa_throw(pvVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::__cxx11::string::string((string *)&__msg,"active",(allocator *)&local_708);
    iVar1 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar1 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_880,
                      "error: you can\'t use --active_cover and --active at the same time");
      pvVar7 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/active_cover.cc"
                 ,0x104,&local_908);
      __cxa_throw(pvVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    _Var8 = data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
            super__Head_base<0UL,_active_cover_*,_false>;
    uVar9 = (data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
             super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->cover_size;
    uVar10 = -(ulong)(uVar9 >> 0x3e != 0) | uVar9 * 4;
    pfVar5 = (float *)operator_new__(uVar10);
    (_Var8._M_head_impl)->lambda_n = pfVar5;
    pfVar5 = (float *)operator_new__(uVar10);
    (_Var8._M_head_impl)->lambda_d = pfVar5;
    for (uVar10 = 0; uVar10 < uVar9; uVar10 = uVar10 + 1) {
      (_Var8._M_head_impl)->lambda_n[uVar10] = 0.0;
      (data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->lambda_d[uVar10] = 0.125;
      uVar9 = (data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_active_cover_*,_false>._M_head_impl)->cover_size;
      _Var8 = data._M_t.super___uniq_ptr_impl<active_cover,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_active_cover_*,_void_(*)(void_*)>.
              super__Head_base<0UL,_active_cover_*,_false>;
    }
    plVar6 = LEARNER::init_learner<active_cover,example,LEARNER::learner<char,example>>
                       (&data,base,predict_or_learn_active_cover<true>,
                        predict_or_learn_active_cover<false>,uVar9 + 1);
    *(undefined8 *)(plVar6 + 0xb8) = *(undefined8 *)(plVar6 + 0x18);
    *(undefined8 *)(plVar6 + 0xc0) = *(undefined8 *)(plVar6 + 0x20);
    *(code **)(plVar6 + 200) = finish;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<active_cover,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar6;
}

Assistant:

base_learner* active_cover_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<active_cover>();
  option_group_definition new_options("Active Learning with Cover");

  bool active_cover_option = false;
  new_options.add(make_option("active_cover", active_cover_option).keep().help("enable active learning with cover"))
      .add(make_option("mellowness", data->active_c0)
               .default_value(8.f)
               .help("active learning mellowness parameter c_0. Default 8."))
      .add(make_option("alpha", data->alpha)
               .default_value(1.f)
               .help("active learning variance upper bound parameter alpha. Default 1."))
      .add(make_option("beta_scale", data->beta_scale)
               .default_value(sqrtf(10.f))
               .help("active learning variance upper bound parameter beta_scale. Default sqrt(10)."))
      .add(make_option("cover", data->cover_size).keep().default_value(12).help("cover size. Default 12."))
      .add(make_option("oracular", data->oracular).help("Use Oracular-CAL style query or not. Default false."));
  options.add_and_parse(new_options);

  if (!active_cover_option)
    return nullptr;

  data->all = &all;
  data->beta_scale *= data->beta_scale;

  if (data->oracular)
    data->cover_size = 0;

  if (options.was_supplied("lda"))
    THROW("error: you can't combine lda and active learning");

  if (options.was_supplied("active"))
    THROW("error: you can't use --active_cover and --active at the same time");

  auto base = as_singleline(setup_base(options, all));

  data->lambda_n = new float[data->cover_size];
  data->lambda_d = new float[data->cover_size];

  for (size_t i = 0; i < data->cover_size; i++)
  {
    data->lambda_n[i] = 0.f;
    data->lambda_d[i] = 1.f / 8.f;
  }

  // Create new learner
  learner<active_cover, example>& l = init_learner(
      data, base, predict_or_learn_active_cover<true>, predict_or_learn_active_cover<false>, data->cover_size + 1);
  l.set_finish(finish);

  return make_base(l);
}